

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncoderVelocity.cpp
# Opt level: O1

void __thiscall
EncoderVelocity::SetDataOld(EncoderVelocity *this,uint32_t rawPeriod,bool useRunCounter)

{
  uint uVar1;
  
  this->velOverflow = false;
  this->velPeriodMax = 0;
  *(undefined4 *)((long)&this->velPeriodMax + 3) = 0;
  this->partialCycle = true;
  this->qtr1Period = 0;
  *(undefined4 *)((long)&this->qtr1Period + 3) = 0;
  this->qtr5Period = 0;
  *(undefined4 *)((long)&this->qtr5Period + 3) = 0;
  this->runOverflow = false;
  this->qtrPeriodMax = 0;
  this->runPeriod = 0;
  this->clkPeriod = 1.3020833333333333e-06;
  this->velPeriodMax = 0xffff;
  uVar1 = rawPeriod & 0xffff;
  this->velPeriod = uVar1;
  if (uVar1 == 0x8000) {
    this->velPeriod = 0x7fff;
    this->velOverflow = true;
  }
  else if ((short)rawPeriod < 0) {
    this->velPeriod = -uVar1;
    this->velDir = false;
  }
  else {
    this->velPeriod = uVar1;
    this->velDir = true;
  }
  if (useRunCounter) {
    uVar1 = rawPeriod >> 0x10;
    if (uVar1 == 0x8000) {
      this->runOverflow = true;
      uVar1 = 0x7fff;
    }
    else if ((int)rawPeriod < 0) {
      uVar1 = -uVar1 & 0xffff;
    }
    this->runPeriod = uVar1;
  }
  return;
}

Assistant:

void EncoderVelocity::SetDataOld(uint32_t rawPeriod, bool useRunCounter)
{
    Init();
    // Prior to Firmware Version 6, the latched counter value is returned
    // as the lower 16 bits. Starting with Firmware Version 4, the upper 16 bits are
    // the free-running counter, which was not used.
    // Note that the counter values are signed, so we convert to unsigned and set a direction bit
    // to be consistent with later versions of firmware.
    clkPeriod = VEL_PERD_OLD;
    velPeriodMax = ENC_VEL_MASK_16;
    velPeriod = static_cast<uint16_t>(rawPeriod & ENC_VEL_MASK_16);
    // Convert from signed count to unsigned count and direction
    if (velPeriod == 0x8000) { // if overflow
        velPeriod = 0x00007fff;
        velOverflow = true;
        // Firmware also sets velPeriod to overflow when direction change occurred, so could potentially
        // set dirChange = true.
    }
    else if (velPeriod & 0x8000) {  // if negative
        velPeriod = ~velPeriod;     // ones complement (16-bits)
        velPeriod = velPeriod + 1;  // twos complement (32-bits)
        velDir = false;
    }
    else {
        velPeriod = velPeriod;
        velDir = true;
    }
    if (useRunCounter) {
        uint16_t runCtr = static_cast<uint16_t>((rawPeriod>>16) & ENC_VEL_MASK_16);
        // Convert from signed count to unsigned count and direction
        if (runCtr == 0x8000) {  // if overflow
            runOverflow = true;
            runCtr = 0x7fff;
        }
        else if (runCtr & 0x8000) {  // if negative
            runCtr = ~runCtr;        // ones complement (16-bits)
            runCtr += 1;             // twos complement (16-bits)
        }
        runPeriod = static_cast<uint32_t>(runCtr);
    }
}